

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  long in_RSI;
  int in_EDI;
  int i;
  uint local_14;
  
  uVar2 = al_install_system(0x5020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log_monospace();
  if (in_EDI < 2) {
    for (local_14 = 1; (int)local_14 < 0x34; local_14 = local_14 + 1) {
      log_printf("# t%d\n\n",(ulong)local_14);
      (*all_tests[(int)local_14])();
      log_printf("\n");
    }
  }
  else {
    iVar1 = atoi(*(char **)(in_RSI + 8));
    if ((0 < iVar1) && (iVar1 < 0x34)) {
      (*all_tests[iVar1])();
    }
  }
  log_printf("Done\n");
  close_log(true);
  if (error == 0) {
    return 0;
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
   int i;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   open_log_monospace();

   if (argc < 2) {
      for (i = 1; i < NUM_TESTS; i++) {
         log_printf("# t%d\n\n", i);
         all_tests[i]();
         log_printf("\n");
      }
   }
   else {
      i = atoi(argv[1]);
      if (i > 0 && i < NUM_TESTS) {
         all_tests[i]();
      }
   }
   log_printf("Done\n");

   close_log(true);

   if (error) {
      exit(EXIT_FAILURE);
   }

   return 0;
}